

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O0

bool bssl::ssl_supports_version(SSL_HANDSHAKE *hs,uint16_t version)

{
  bool bVar1;
  ushort local_2a;
  SSL *pSStack_28;
  uint16_t protocol_version;
  SSL *ssl;
  SSL_HANDSHAKE *pSStack_18;
  uint16_t version_local;
  SSL_HANDSHAKE *hs_local;
  
  pSStack_28 = hs->ssl;
  ssl._6_2_ = version;
  pSStack_18 = hs;
  bVar1 = ssl_method_supports_version(pSStack_28->method,version);
  if ((((bVar1) && (bVar1 = ssl_protocol_version_from_wire(&local_2a,ssl._6_2_), bVar1)) &&
      (pSStack_18->min_version <= local_2a)) && (local_2a <= pSStack_18->max_version)) {
    hs_local._7_1_ = true;
  }
  else {
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_supports_version(const SSL_HANDSHAKE *hs, uint16_t version) {
  const SSL *const ssl = hs->ssl;
  uint16_t protocol_version;
  if (!ssl_method_supports_version(ssl->method, version) ||
      !ssl_protocol_version_from_wire(&protocol_version, version) ||
      hs->min_version > protocol_version ||
      protocol_version > hs->max_version) {
    return false;
  }

  return true;
}